

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::~AMFImporter(AMFImporter *this)

{
  AMFImporter *this_local;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f3f7d0;
  if ((this->mReader != (IrrXMLReader *)0x0) && (this->mReader != (IrrXMLReader *)0x0)) {
    (*this->mReader->_vptr_IIrrXMLReader[1])();
  }
  Clear(this);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::~list
            (&this->mTexture_Converted);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>::~list
            (&this->mMaterial_Converted);
  std::__cxx11::string::~string((string *)&this->mUnit);
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::~list
            (&this->mNodeElement_List);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

AMFImporter::~AMFImporter()
{
	if(mReader != nullptr) delete mReader;
	// Clear() is accounting if data already is deleted. So, just check again if all data is deleted.
	Clear();
}